

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

Index __thiscall
BayesianGameCollaborativeGraphical::JointToGroupActionIndex
          (BayesianGameCollaborativeGraphical *this,Index e,Index jaI)

{
  BayesianGameIdenticalPayoff *pBVar1;
  Index IVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivActions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  IndexTools::JointToIndividualIndicesStepSize
            (&local_30,jaI,
             (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
             _m_stepSizeActions,
             (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrAgents);
  RestrictIndividualIndicesToScope<unsigned_int>(&local_48,this,&local_30,e);
  pBVar1 = (this->_m_LRFs).
           super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
           ._M_impl.super__Vector_impl_data._M_start[e];
  IVar2 = (**(code **)(*(long *)&(pBVar1->super_BayesianGameIdenticalPayoffInterface).
                                 super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure
                      + 0x38))(pBVar1,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar2;
}

Assistant:

Index BayesianGameCollaborativeGraphical::
JointToGroupActionIndex(Index e, Index jaI) const
{
    const vector<Index> &indActions = JointToIndividualActionIndices(jaI);
    vector<Index> restrictedIndivActions = RestrictIndividualIndicesToScope(
            indActions, e);    
    Index jaGI = _m_LRFs[e]->
        IndividualToJointActionIndices(restrictedIndivActions);
    return(jaGI);
}